

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Testrunner.cpp
# Opt level: O2

void runMoira(Setup *s,Result *r)

{
  u8 uVar1;
  u8 uVar2;
  uint uVar3;
  i64 iVar4;
  TestCPU *this;
  int iVar5;
  clock_t cVar6;
  clock_t cVar7;
  DasmNumberFormat value;
  DasmNumberFormat value_00;
  
  this = moiracpu;
  uVar3 = (moiracpu->super_Moira).reg.pc;
  r->oldpc = uVar3;
  r->opcode = CONCAT11(moiraMem[uVar3 & 0xffff],moiraMem[uVar3 + 1 & 0xffff]);
  r->elapsed[0] = 0;
  r->elapsed[1] = 0;
  moira::Moira::setDasmSyntax(&this->super_Moira,MUSASHI);
  value.radix = '\x10';
  value.upperCase = false;
  value.plainZero = false;
  value._11_5_ = 0;
  value.prefix = "$";
  moira::Moira::setDasmNumberFormat(&moiracpu->super_Moira,value);
  cVar6 = clock();
  iVar5 = moira::Moira::disassemble(&moiracpu->super_Moira,r->dasmMusashi,r->oldpc);
  r->dasmCntMusashi = iVar5;
  cVar7 = clock();
  r->elapsed[1] = cVar7 - cVar6;
  moira::Moira::setDasmSyntax(&moiracpu->super_Moira,GNU);
  value_00.radix = '\n';
  value_00.upperCase = false;
  value_00.plainZero = true;
  value_00._11_5_ = 0;
  value_00.prefix = "$";
  moira::Moira::setDasmNumberFormat(&moiracpu->super_Moira,value_00);
  iVar5 = moira::Moira::disassemble(&moiracpu->super_Moira,r->dasmBinutils,r->oldpc);
  r->dasmCntBinutils = iVar5;
  if (r->opcode < 0xf000) {
    iVar4 = (moiracpu->super_Moira).clock;
    uVar3 = (moiracpu->super_Moira).reg.pc;
    uVar1 = moiraMem[uVar3 & 0xffff];
    uVar2 = moiraMem[(ushort)((short)uVar3 + 1)];
    cVar6 = clock();
    moira::Moira::execute(&moiracpu->super_Moira);
    cVar7 = clock();
    r->elapsed[0] = cVar7 - cVar6;
    r->cycles = (int)(moiracpu->super_Moira).clock - (int)iVar4;
    r->oldpc = uVar3;
    r->opcode = CONCAT11(uVar1,uVar2);
    recordMoiraRegisters(r);
    return;
  }
  return;
}

Assistant:

void runMoira(Setup &s, Result &r)
{
    r.oldpc = moiracpu->getPC();
    r.opcode = get16(moiraMem, r.oldpc);
    r.elapsed[0] = r.elapsed[1] = 0;

    // Disassemble the instruction
    if (doDasm(r.opcode)) {

        // Disassemble the instruction in Musashi format
        moiracpu->setDasmSyntax(Syntax::MUSASHI);
        moiracpu->setDasmNumberFormat({ .prefix = "$", .radix = 16 });
        clock_t elapsed = clock();
        r.dasmCntMusashi = moiracpu->disassemble(r.dasmMusashi, r.oldpc);
        r.elapsed[1] = clock() - elapsed;

        // Disassemble the instruction in GNU format (binutils)
#ifdef MOTOROLA
        moiracpu->setDasmSyntax(Syntax::GNU);
#else
        moiracpu->setDasmSyntax(Syntax::GNU_MIT);
#endif
        moiracpu->setDasmNumberFormat({ .prefix = "$", .radix = 10, .plainZero = true });
        r.dasmCntBinutils = moiracpu->disassemble(r.dasmBinutils, r.oldpc);
    }

    // Run the Moira CPU
    if (doExec(r.opcode)) {

        u32 pc = moiracpu->getPC();
        u16 op = get16(moiraMem, pc);

        int64_t cycles = moiracpu->getClock();

        if (VERBOSE)
            printf("$%04x ($%04x): %s (Moira)\n", r.oldpc, r.opcode, r.dasmMusashi);

        // Execute instruction
        clock_t elapsed = clock();
        moiracpu->execute();
        r.elapsed[0] = clock() - elapsed;

        // Record the result
        r.cycles = (int)(moiracpu->getClock() - cycles);
        r.oldpc = pc;
        r.opcode = op;
        recordMoiraRegisters(r);
    }
}